

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

ostream * fasttext::operator<<(ostream *os,Vector *v)

{
  _Setprecision _Var1;
  ostream *poVar2;
  long *in_RSI;
  ostream *in_RDI;
  int64_t j;
  long local_20;
  
  _Var1 = std::setprecision(5);
  std::operator<<(in_RDI,_Var1);
  for (local_20 = 0; local_20 < *in_RSI; local_20 = local_20 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(in_RDI,*(float *)(in_RSI[1] + local_20 * 4));
    std::operator<<(poVar2,' ');
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector& v)
{
  os << std::setprecision(5);
  for (int64_t j = 0; j < v.m_; j++) {
    os << v.data_[j] << ' ';
  }
  return os;
}